

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O3

void __thiscall cab_session::send_request(cab_session *this,request *request)

{
  state_type sVar1;
  socket_type sVar2;
  service_type *psVar3;
  error_category *peVar4;
  bool bVar5;
  undefined3 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  pointer puVar8;
  reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  pointer puVar9;
  undefined8 uVar10;
  size_t i;
  long lVar11;
  size_t sVar12;
  long in_FS_OFFSET;
  bool bVar13;
  external_add_request_message add_message;
  buffer_writer writer;
  buffer write_buffer;
  shared_ptr<cab_session> self;
  node_type local_ae [2];
  uint32_t local_ac;
  anon_class_24_2_3fe5b907 local_a8;
  ptr local_90;
  buffer local_78;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  base_implementation_type *local_48;
  reactive_socket_service_base *local_40;
  pointer local_38;
  
  local_ae[0] = ::request::src(request);
  local_ae[1] = ::request::dst(request);
  local_ac = ::request::passengers(request);
  std::__shared_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<cab_session,void>
            ((__shared_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_writer::buffer_writer((buffer_writer *)&local_90,&local_78);
  local_a8.this = (cab_session *)CONCAT35(local_a8.this._5_3_,0x4500000000);
  local_a8.this = (cab_session *)CONCAT44(local_a8.this._4_4_,0xb);
  ::operator<<((buffer_writer *)&local_90,(message_header *)&local_a8);
  lVar11 = 0;
  do {
    buffer_writer::operator<<((buffer_writer *)&local_90,local_ae[lVar11]);
    puVar8 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 6);
  local_38 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  sVar12 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  puVar9 = (pointer)0x0;
  if (sVar12 != 0) {
    puVar9 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_50;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  psVar3 = (this->_socket).
           super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           .impl_.service_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_a8.this = this;
  local_90.h = &local_a8;
  op = (reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::detail::thread_info_base::
          allocate<boost::asio::detail::thread_info_base::default_tag>(uVar10,0xa0);
  _Var7._M_pi = local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_40 = &psVar3->super_reactive_socket_service_base;
  local_48 = &(this->_socket).
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.implementation_.super_base_implementation_type;
  bVar13 = local_38 == puVar8;
  sVar2 = (this->_socket).
          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          .impl_.implementation_.super_base_implementation_type.socket_;
  sVar1 = (this->_socket).
          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          .impl_.implementation_.super_base_implementation_type.state_;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  super_operation.next_ = (scheduler_operation *)0x0;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  super_operation.func_ =
       boost::asio::detail::
       reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/cab_session.cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  super_operation.task_result_ = 0;
  bVar5 = (psVar3->super_reactive_socket_service_base).success_ec_.failed_;
  uVar6 = *(undefined3 *)&(psVar3->super_reactive_socket_service_base).success_ec_.field_0x5;
  peVar4 = (psVar3->super_reactive_socket_service_base).success_ec_.cat_;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.ec_.val_ =
       (psVar3->super_reactive_socket_service_base).success_ec_.val_;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.ec_.
  failed_ = bVar5;
  *(undefined3 *)
   &(op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.ec_.
    field_0x5 = uVar6;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.ec_.cat_ =
       peVar4;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  perform_func_ =
       boost::asio::detail::reactive_socket_send_op_base<boost::asio::const_buffers_1>::do_perform;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).socket_ = sVar2;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).state_ = sVar1;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).buffers_.super_const_buffer
  .data_ = puVar9;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).buffers_.super_const_buffer
  .size_ = sVar12;
  (op->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).flags_ = 0;
  (op->handler_).this = local_a8.this;
  (op->handler_).self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (op->handler_).self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var7._M_pi;
  local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_90.v = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(this->_socket).
                        super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        .impl_.executor_);
  local_90.p = op;
  boost::asio::detail::reactive_socket_service_base::start_op
            (local_40,local_48,1,(reactor_op *)op,false,true,
             (bool)((this->_socket).
                    super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    .impl_.implementation_.super_base_implementation_type.state_ >> 4 & bVar13));
  local_90.v = (reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_90.p = (reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  boost::asio::detail::
  reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/cab_session.cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset(&local_90);
  if (local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void cab_session::send_request(request& request)
{
    external_add_request_message add_message;
    add_message.src = static_cast<std::uint8_t>(request.src());
    add_message.dst = static_cast<std::uint8_t>(request.dst());
    add_message.passengers = request.passengers();

    auto self = shared_from_this();
    _socket.async_send(boost::asio::buffer(add_message.to_buffer()), [this, self](boost::system::error_code error_code, std::size_t written)
    {
        std::cout << "Data sent " << written << std::endl;
    });
}